

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

char * __thiscall leveldb::Arena::AllocateNewBlock(Arena *this,size_t block_bytes)

{
  pointer *pppcVar1;
  iterator __position;
  char *result;
  char *local_18;
  
  local_18 = (char *)operator_new__(block_bytes);
  __position._M_current =
       (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
              ((vector<char*,std::allocator<char*>> *)&this->blocks_,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppcVar1 = &(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  LOCK();
  (this->memory_usage_).super___atomic_base<unsigned_long>._M_i =
       (this->memory_usage_).super___atomic_base<unsigned_long>._M_i + block_bytes + 8;
  UNLOCK();
  return local_18;
}

Assistant:

char* Arena::AllocateNewBlock(size_t block_bytes) {
  char* result = new char[block_bytes];
  blocks_.push_back(result);
  memory_usage_.fetch_add(block_bytes + sizeof(char*),
                          std::memory_order_relaxed);
  return result;
}